

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cpp
# Opt level: O0

int __thiscall
VehicleState::clone(VehicleState *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  double dVar1;
  int iVar2;
  Point *pPVar3;
  element_type *peVar4;
  VehicleState *this_local;
  shared_ptr<VehicleState> *vs;
  
  std::make_shared<VehicleState>();
  pPVar3 = *(Point **)__fn;
  peVar4 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  peVar4->p = pPVar3;
  iVar2 = *(int *)(__fn + 8);
  peVar4 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  peVar4->current_cargo = iVar2;
  dVar1 = *(double *)(__fn + 0x10);
  peVar4 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  peVar4->current_time = dVar1;
  dVar1 = *(double *)(__fn + 0x18);
  peVar4 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  peVar4->current_distance = dVar1;
  return (int)this;
}

Assistant:

std::shared_ptr<VehicleState> VehicleState::clone()
const {
	auto vs = std::make_shared<VehicleState>();
	vs->p = this->p;
	
	vs->current_cargo = this->current_cargo;
	vs->current_time = this->current_time;
	vs->current_distance = this->current_distance;
	return vs;
}